

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetTracerExpCreate
          (zet_context_handle_t hContext,zet_tracer_exp_desc_t *desc,
          zet_tracer_exp_handle_t *phTracer)

{
  object_t<_zet_tracer_exp_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  zet_pfnTracerExpCreate_t pfnCreate;
  dditable_t *dditable;
  zet_tracer_exp_handle_t *pp_Stack_28;
  ze_result_t result;
  zet_tracer_exp_handle_t *phTracer_local;
  zet_tracer_exp_desc_t *desc_local;
  zet_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(zet_pfnTracerExpCreate_t *)(hContext + 8);
  if (*(code **)(pfnCreate + 0x7f8) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    desc_local = *(zet_tracer_exp_desc_t **)hContext;
    pp_Stack_28 = phTracer;
    phTracer_local = (zet_tracer_exp_handle_t *)desc;
    dditable._4_4_ = (**(code **)(pfnCreate + 0x7f8))(desc_local,desc,phTracer);
    hContext_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_zet_tracer_exp_handle_t*>,_zet_tracer_exp_handle_t*>::
               getInstance<_zet_tracer_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_tracer_exp_handle_t*>,_zet_tracer_exp_handle_t*>
                           *)(context + 0x14a0),pp_Stack_28,(dditable_t **)&pfnCreate);
      *pp_Stack_28 = (zet_tracer_exp_handle_t)poVar1;
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetTracerExpCreate(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        const zet_tracer_exp_desc_t* desc,              ///< [in] pointer to tracer descriptor
        zet_tracer_exp_handle_t* phTracer               ///< [out] pointer to handle of tracer object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_context_object_t*>( hContext )->dditable;
        auto pfnCreate = dditable->zet.TracerExp.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<zet_context_object_t*>( hContext )->handle;

        // forward to device-driver
        result = pfnCreate( hContext, desc, phTracer );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phTracer = reinterpret_cast<zet_tracer_exp_handle_t>(
                context->zet_tracer_exp_factory.getInstance( *phTracer, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }